

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryInvocationCase::init
          (GeometryInvocationCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  InvocationCountShader *this_00;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  ContextType ctxType;
  deUint32 dVar6;
  undefined4 extraout_var;
  NotSupportedError *pNVar7;
  ShaderProgramDeclaration *pSVar8;
  pointer pcVar9;
  ostream *poVar10;
  long lVar11;
  OutputCase OVar12;
  char *pcVar13;
  int maxGeometryShaderInvocations;
  int maxComponents;
  size_type __dnew;
  ContextType local_4c0;
  int local_4bc;
  ulong local_4b8;
  int local_4ac;
  InvocationCountShader *local_4a8;
  string local_4a0;
  FragmentSource local_480;
  string local_460;
  VertexSource local_440;
  undefined4 *local_420;
  undefined8 local_418;
  undefined4 local_410;
  undefined4 uStack_40c;
  long *local_400;
  undefined8 local_3f8;
  long local_3f0;
  undefined2 local_3e8;
  undefined1 local_3e6;
  FragmentOutput local_3dc;
  VertexAttribute local_3d8;
  VertexAttribute local_3b0;
  string local_388;
  GeometrySource local_368;
  string local_348;
  string local_328;
  string local_308;
  GeometryToFragmentVarying local_2e8;
  VertexToGeometryVarying local_2e0;
  undefined1 local_2d8 [112];
  ios_base local_268 [8];
  ios_base local_260 [264];
  GeometryShaderDeclaration local_158;
  ShaderProgramDeclaration local_140;
  
  iVar5 = (*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar5);
  local_4bc = 0;
  local_4ac = 0;
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(ctxType,(ApiType)0x23);
  if ((!bVar4) &&
     (bVar4 = glu::ContextInfo::isExtensionSupported
                        (((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->
                         m_contextInfo,"GL_EXT_geometry_shader"), !bVar4)) {
    pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar7,"Tests require GL_EXT_geometry_shader extension or higher context version.",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
               ,0x10e8);
    __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar11 + 0x868))(0x8e5a,&local_4bc);
  dVar6 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar6,"getIntegerv(GL_MAX_GEOMETRY_SHADER_INVOCATIONS)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x10eb);
  (**(code **)(lVar11 + 0x868))(0x8de1,&local_4ac);
  dVar6 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar6,"getIntegerv(GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x10ee);
  local_2d8._0_8_ =
       ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_2d8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"GL_MAX_GEOMETRY_SHADER_INVOCATIONS = ",0x25);
  std::ostream::operator<<(poVar1,local_4bc);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_260);
  if (this->m_numInvocations == -1) {
    this->m_numInvocations = local_4bc;
  }
  else if (local_4bc < this->m_numInvocations) {
    pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_2d8._0_8_ = local_2d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2d8,"Test requires larger GL_MAX_GEOMETRY_SHADER_INVOCATIONS","");
    tcu::NotSupportedError::NotSupportedError(pNVar7,(string *)local_2d8);
    __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (this->m_testCase == CASE_FIXED_OUTPUT_COUNTS) {
    local_2d8._0_8_ =
         ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_2d8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Rendering triangles in a partial circle formation with a geometry shader. Each triangle is generated by a separate invocation.\n"
               ,0x7f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Drawing 2 points, each generating ",0x22);
    std::ostream::operator<<(poVar1,this->m_numInvocations);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," triangles.",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_003b2199:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_2d8 + 8));
    std::ios_base::~ios_base(local_260);
  }
  else if (this->m_testCase == CASE_DIFFERENT_OUTPUT_COUNTS) {
    if (local_4ac < this->m_numInvocations * 8 + 0x10) {
      pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_2d8._0_8_ = local_2d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2d8,"Test requires larger GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS",
                 "");
      tcu::NotSupportedError::NotSupportedError(pNVar7,(string *)local_2d8);
      __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    local_2d8._0_8_ =
         ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_2d8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Rendering n-gons in a partial circle formation with a geometry shader. Each n-gon is generated by a separate invocation.\n"
               ,0x79);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Drawing 2 points, each generating ",0x22);
    std::ostream::operator<<(poVar1,this->m_numInvocations);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," n-gons.",8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    goto LAB_003b2199;
  }
  local_4a8 = (InvocationCountShader *)operator_new(0x160);
  local_4c0.super_ApiType.m_bits =
       (ApiType)(*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[2])();
  local_4b8 = (ulong)(uint)this->m_numInvocations;
  OVar12 = (this->m_testCase != CASE_DIFFERENT_OUTPUT_COUNTS) + CASE_DIFFERENT_OUTPUT_COUNTS;
  if (this->m_testCase == CASE_FIXED_OUTPUT_COUNTS) {
    OVar12 = CASE_FIXED_OUTPUT_COUNTS;
  }
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_140);
  local_400 = &local_3f0;
  local_3f0 = 0x697469736f705f61;
  local_3e8 = 0x6e6f;
  local_3f8 = 10;
  local_3e6 = 0;
  local_3b0.name._M_dataplus._M_p = (pointer)&local_3b0.name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_3b0);
  local_3b0.type = GENERICVECTYPE_FLOAT;
  pSVar8 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,&local_3b0);
  local_420 = &local_410;
  local_410 = 0x6f635f61;
  local_418 = 7;
  uStack_40c = 0x726f6c;
  local_3d8.name._M_dataplus._M_p = (pointer)&local_3d8.name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_3d8);
  local_3d8.type = GENERICVECTYPE_FLOAT;
  pSVar8 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar8,&local_3d8);
  local_2e0.type = GENERICVECTYPE_FLOAT;
  local_2e0.flatshade = false;
  pSVar8 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar8,&local_2e0);
  local_2e8.type = GENERICVECTYPE_FLOAT;
  local_2e8.flatshade = false;
  pSVar8 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar8,&local_2e8);
  local_3dc.type = GENERICVECTYPE_FLOAT;
  pSVar8 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar8,&local_3dc);
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  local_2d8._0_8_ = (TestLog *)0xc9;
  pcVar9 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_460,(ulong)local_2d8);
  uVar3 = local_2d8._0_8_;
  local_460.field_2._M_allocated_capacity = local_2d8._0_8_;
  local_460._M_dataplus._M_p = pcVar9;
  memcpy(pcVar9,
         "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_color;\nout highp vec4 v_geom_FragColor;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tgl_PointSize = 1.0;\n\tv_geom_FragColor = a_color;\n}\n"
         ,0xc9);
  local_460._M_string_length = uVar3;
  pcVar9[uVar3] = '\0';
  specializeShader(&local_328,&local_460,&local_4c0);
  local_440.source._M_dataplus._M_p = (pointer)&local_440.source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_440,local_328._M_dataplus._M_p,
             local_328._M_dataplus._M_p + local_328._M_string_length);
  pSVar8 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar8,&local_440);
  local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
  local_2d8._0_8_ = (TestLog *)0x9c;
  pcVar9 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_4a0,(ulong)local_2d8);
  uVar3 = local_2d8._0_8_;
  local_4a0.field_2._M_allocated_capacity = local_2d8._0_8_;
  local_4a0._M_dataplus._M_p = pcVar9;
  memcpy(pcVar9,
         "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_frag_FragColor;\nvoid main (void)\n{\n\tfragColor = v_frag_FragColor;\n}\n"
         ,0x9c);
  local_4a0._M_string_length = uVar3;
  pcVar9[uVar3] = '\0';
  specializeShader(&local_348,&local_4a0,&local_4c0);
  this_00 = local_4a8;
  local_480.source._M_dataplus._M_p = (pointer)&local_480.source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_480,local_348._M_dataplus._M_p,
             local_348._M_dataplus._M_p + local_348._M_string_length);
  pSVar8 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar8,&local_480);
  local_158.numInvocations = (size_t)(int)local_4b8;
  if (OVar12 == CASE_FIXED_OUTPUT_COUNTS) {
    local_158.numOutputVertices = 3;
  }
  else if (OVar12 == CASE_DIFFERENT_OUTPUT_COUNTS) {
    local_158.numOutputVertices = (size_t)((int)local_4b8 + 2);
  }
  else {
    local_158.numOutputVertices = 0;
  }
  local_158.inputType = GEOMETRYSHADERINPUTTYPE_POINTS;
  local_158.outputType = GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP;
  pSVar8 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar8,&local_158);
  if (OVar12 == CASE_FIXED_OUTPUT_COUNTS) {
    iVar5 = 3;
  }
  else if (OVar12 == CASE_DIFFERENT_OUTPUT_COUNTS) {
    iVar5 = (int)local_4b8 + 2;
  }
  else {
    iVar5 = 0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2d8,
             "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout(points, invocations = ",0x4d);
  poVar10 = (ostream *)std::ostream::operator<<(local_2d8,(int)local_4b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,") in;\nlayout(triangle_strip, max_vertices = ",0x2c);
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,
             ") out;\n\nin highp vec4 v_geom_FragColor[];\nout highp vec4 v_frag_FragColor;\n\nvoid main ()\n{\n\thighp float l_angle = float(gl_InvocationID) / float("
             ,0x91);
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_4b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,") * 5.5;\n\thighp float l_radius = 0.6;\n\n",0x27);
  if (OVar12 == CASE_DIFFERENT_OUTPUT_COUNTS) {
    lVar11 = 0x33c;
    pcVar13 = 
    "\thighp vec4 l_color = vec4(float(gl_InvocationID % 2), (((gl_InvocationID / 2) % 2) == 0) ? (1.0) : (0.0), 1.0, 1.0);\n\thighp vec4 basePosition = gl_in[0].gl_Position + vec4(cos(l_angle) * l_radius, sin(l_angle) * l_radius, 0.0, 0.0);\n\tmediump int numNgonVtx = gl_InvocationID + 3;\n\n\tfor (int ndx = 0; ndx + 1 < numNgonVtx; ndx += 2)\n\t{\n\t\thighp float sub_angle = (float(ndx) + 1.0) / float(numNgonVtx) * 3.141;\n\n\t\tv_frag_FragColor = l_color;\n\t\tgl_Position = basePosition + vec4(cos(sub_angle) * 0.1, sin(sub_angle) * 0.1, 0.0, 0.0);\n\t\tEmitVertex();\n\n\t\tv_frag_FragColor = l_color;\n\t\tgl_Position = basePosition + vec4(cos(sub_angle) * 0.1, sin(sub_angle) * -0.1, 0.0, 0.0);\n\t\tEmitVertex();\n\t}\n\tif ((numNgonVtx % 2) == 1)\n\t{\n\t\tv_frag_FragColor = l_color;\n\t\tgl_Position = basePosition + vec4(-0.1, 0.0, 0.0, 0.0);\n\t\tEmitVertex();\n\t}\n"
    ;
  }
  else {
    if (OVar12 != CASE_FIXED_OUTPUT_COUNTS) goto LAB_003b259c;
    lVar11 = 0x253;
    pcVar13 = 
    "\tv_frag_FragColor = vec4(1.0, 1.0, 0.0, 1.0) * v_geom_FragColor[0];\n\tgl_Position = gl_in[0].gl_Position + vec4(cos(l_angle) * (l_radius - 0.1), sin(l_angle) * (l_radius - 0.1), 0.0, 0.0);\n\tEmitVertex();\n\n\tv_frag_FragColor = vec4(1.0, 0.0, 0.0, 1.0) * v_geom_FragColor[0];\n\tgl_Position = gl_in[0].gl_Position + vec4(cos(l_angle+0.1) * l_radius, sin(l_angle+0.1) * l_radius, 0.0, 0.0);\n\tEmitVertex();\n\n\tv_frag_FragColor = vec4(1.0, 0.0, 0.0, 1.0) * v_geom_FragColor[0];\n\tgl_Position = gl_in[0].gl_Position + vec4(cos(l_angle-0.1) * l_radius, sin(l_angle-0.1) * l_radius, 0.0, 0.0);\n\tEmitVertex();\n"
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,pcVar13,lVar11);
LAB_003b259c:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"}\n",2);
  std::__cxx11::stringbuf::str();
  specializeShader(&local_388,&local_308,&local_4c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
  std::ios_base::~ios_base(local_268);
  paVar2 = &local_368.source.field_2;
  local_368.source._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_368,local_388._M_dataplus._M_p,
             local_388._M_dataplus._M_p + local_388._M_string_length);
  pSVar8 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar8,&local_368);
  sglr::ShaderProgram::ShaderProgram(&this_00->super_ShaderProgram,pSVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.source._M_dataplus._M_p != paVar2) {
    pSVar8 = (ShaderProgramDeclaration *)(local_368.source.field_2._M_allocated_capacity + 1);
    operator_delete(local_368.source._M_dataplus._M_p,(ulong)pSVar8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    pSVar8 = (ShaderProgramDeclaration *)(local_388.field_2._M_allocated_capacity + 1);
    operator_delete(local_388._M_dataplus._M_p,(ulong)pSVar8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480.source._M_dataplus._M_p != &local_480.source.field_2) {
    pSVar8 = (ShaderProgramDeclaration *)(local_480.source.field_2._M_allocated_capacity + 1);
    operator_delete(local_480.source._M_dataplus._M_p,(ulong)pSVar8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    pSVar8 = (ShaderProgramDeclaration *)(local_348.field_2._M_allocated_capacity + 1);
    operator_delete(local_348._M_dataplus._M_p,(ulong)pSVar8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    pSVar8 = (ShaderProgramDeclaration *)(local_4a0.field_2._M_allocated_capacity + 1);
    operator_delete(local_4a0._M_dataplus._M_p,(ulong)pSVar8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440.source._M_dataplus._M_p != &local_440.source.field_2) {
    pSVar8 = (ShaderProgramDeclaration *)(local_440.source.field_2._M_allocated_capacity + 1);
    operator_delete(local_440.source._M_dataplus._M_p,(ulong)pSVar8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    pSVar8 = (ShaderProgramDeclaration *)(local_328.field_2._M_allocated_capacity + 1);
    operator_delete(local_328._M_dataplus._M_p,(ulong)pSVar8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    pSVar8 = (ShaderProgramDeclaration *)(local_460.field_2._M_allocated_capacity + 1);
    operator_delete(local_460._M_dataplus._M_p,(ulong)pSVar8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.name._M_dataplus._M_p != &local_3d8.name.field_2) {
    pSVar8 = (ShaderProgramDeclaration *)(local_3d8.name.field_2._M_allocated_capacity + 1);
    operator_delete(local_3d8.name._M_dataplus._M_p,(ulong)pSVar8);
  }
  if (local_420 != &local_410) {
    pSVar8 = (ShaderProgramDeclaration *)(CONCAT44(uStack_40c,local_410) + 1);
    operator_delete(local_420,(ulong)pSVar8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.name._M_dataplus._M_p != &local_3b0.name.field_2) {
    pSVar8 = (ShaderProgramDeclaration *)(local_3b0.name.field_2._M_allocated_capacity + 1);
    operator_delete(local_3b0.name._M_dataplus._M_p,(ulong)pSVar8);
  }
  if (local_400 != &local_3f0) {
    pSVar8 = (ShaderProgramDeclaration *)(local_3f0 + 1);
    operator_delete(local_400,(ulong)pSVar8);
  }
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (this_00->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_00b46920;
  (this_00->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_00b46958;
  (this_00->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_00b46970;
  *(int *)&(this_00->super_ShaderProgram).field_0x154 = (int)local_4b8;
  this_00->m_testCase = OVar12;
  this->m_program = this_00;
  iVar5 = GeometryShaderRenderTest::init
                    (&this->super_GeometryShaderRenderTest,(EVP_PKEY_CTX *)pSVar8);
  return iVar5;
}

Assistant:

void GeometryInvocationCase::init (void)
{
	const glw::Functions&	gl								= m_context.getRenderContext().getFunctions();
	int						maxGeometryShaderInvocations	= 0;
	int						maxComponents					= 0;

	// requirements

	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
		TCU_THROW(NotSupportedError, "Tests require GL_EXT_geometry_shader extension or higher context version.");

	gl.getIntegerv(GL_MAX_GEOMETRY_SHADER_INVOCATIONS, &maxGeometryShaderInvocations);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getIntegerv(GL_MAX_GEOMETRY_SHADER_INVOCATIONS)");

	gl.getIntegerv(GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS, &maxComponents);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getIntegerv(GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS)");

	m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_SHADER_INVOCATIONS = " << maxGeometryShaderInvocations << tcu::TestLog::EndMessage;

	// set target num invocations

	if (m_numInvocations == -1)
		m_numInvocations = maxGeometryShaderInvocations;
	else if (maxGeometryShaderInvocations < m_numInvocations)
		throw tcu::NotSupportedError("Test requires larger GL_MAX_GEOMETRY_SHADER_INVOCATIONS");

	if (m_testCase == CASE_DIFFERENT_OUTPUT_COUNTS)
	{
		const int maxEmitCount	= m_numInvocations + 2;
		const int numComponents	= 8; // pos + color
		if (maxEmitCount * numComponents > maxComponents)
			throw tcu::NotSupportedError("Test requires larger GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS");
	}

	// Log what the test tries to do

	if (m_testCase == CASE_FIXED_OUTPUT_COUNTS)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Rendering triangles in a partial circle formation with a geometry shader. Each triangle is generated by a separate invocation.\n"
			<< "Drawing 2 points, each generating " << m_numInvocations << " triangles."
			<< tcu::TestLog::EndMessage;
	}
	else if (m_testCase == CASE_DIFFERENT_OUTPUT_COUNTS)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Rendering n-gons in a partial circle formation with a geometry shader. Each n-gon is generated by a separate invocation.\n"
			<< "Drawing 2 points, each generating " << m_numInvocations << " n-gons."
			<< tcu::TestLog::EndMessage;
	}
	else
		DE_ASSERT(false);

	// resources

	m_program = new InvocationCountShader(m_context.getRenderContext().getType(), m_numInvocations, mapToShaderCaseType(m_testCase));

	GeometryShaderRenderTest::init();
}